

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O0

void __thiscall ZmqContextManager::ZmqContextManager(ZmqContextManager *this,string *contextName)

{
  int *in_RSI;
  atomic<bool> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  undefined1 __i;
  atomic<bool> *this_00;
  atomic<bool> *__args;
  
  this_00 = in_RDI;
  __args = in_RDI;
  std::__cxx11::string::string(in_stack_00000010,in_stack_00000008);
  __i = (undefined1)((ulong)in_RDI >> 0x38);
  std::make_unique<zmq::context_t,int,int>((int *)__args,in_RSI);
  CLI::std::atomic<bool>::atomic(this_00,(bool)__i);
  return;
}

Assistant:

ZmqContextManager::ZmqContextManager(const std::string& contextName):
    name(contextName), zcontext(std::make_unique<zmq::context_t>(1, 4096))
{
}